

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O1

int cinatra::detail::phr_parse_request
              (char *buf_start,size_t len,char **method,size_t *method_len,char **path,
              size_t *path_len,int *minor_version,http_header *headers,size_t *num_headers,
              size_t last_len,bool *has_connection,bool *has_close,bool *has_upgrade,bool *has_query
              )

{
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  int unaff_EBP;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  bool *pbVar12;
  bool bVar13;
  char cVar14;
  size_t sVar15;
  byte *pbVar16;
  byte *local_48;
  size_t local_40;
  
  pbVar1 = (byte *)(buf_start + len);
  sVar3 = *num_headers;
  iVar8 = 0;
  *method = (char *)0x0;
  *method_len = 0;
  *path = (char *)0x0;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;
  if (last_len != 0) {
    pbVar9 = (byte *)(buf_start + (last_len - 3));
    if (last_len < 3) {
      pbVar9 = (byte *)buf_start;
    }
    unaff_EBP = -2;
    do {
      bVar13 = true;
      if (pbVar9 == pbVar1) goto LAB_0012be41;
      pbVar16 = pbVar9 + 1;
      if (*pbVar9 == 10) {
LAB_0012be26:
        iVar11 = iVar8 + 1;
      }
      else {
        iVar11 = 0;
        if (*pbVar9 == 0xd) {
          if (pbVar16 != pbVar1) {
            if (*pbVar16 == 10) {
              pbVar16 = pbVar9 + 2;
              goto LAB_0012be26;
            }
            unaff_EBP = -1;
          }
          goto LAB_0012be41;
        }
      }
      iVar8 = iVar11;
      pbVar9 = pbVar16;
    } while (iVar8 != 2);
    bVar13 = false;
LAB_0012be41:
    if (bVar13) {
      return unaff_EBP;
    }
  }
  iVar11 = -2;
  iVar8 = -2;
  if (last_len != len) {
    pbVar9 = (byte *)(buf_start + last_len);
    if (*pbVar9 == 10) {
      pbVar9 = pbVar9 + 1;
    }
    else if (*pbVar9 == 0xd) {
      if (pbVar9 + 1 != pbVar1) {
        if (pbVar9[1] == 10) {
          pbVar9 = pbVar9 + 2;
          goto LAB_0012be91;
        }
        iVar8 = -1;
      }
      goto LAB_0012c36d;
    }
LAB_0012be91:
    if (pbVar9 == pbVar1) {
LAB_0012bed3:
      bVar13 = false;
      iVar8 = iVar11;
    }
    else {
      sVar15 = 0;
      do {
        bVar2 = pbVar9[sVar15];
        if (bVar2 == 0x20) {
          *method = (char *)pbVar9;
          *method_len = sVar15;
          pbVar9 = pbVar9 + sVar15;
          bVar13 = true;
          iVar8 = unaff_EBP;
          goto LAB_0012beeb;
        }
        if ((bVar2 - 0x7f < 0xffffffa1) && ((bVar2 < 0x20 || (bVar2 == 0x7f)))) {
          pbVar9 = pbVar9 + sVar15;
          iVar11 = -1;
          goto LAB_0012bed3;
        }
        lVar4 = sVar15 + 1;
        sVar15 = sVar15 + 1;
      } while (pbVar9 + lVar4 != pbVar1);
      bVar13 = false;
      pbVar9 = pbVar1;
      iVar8 = iVar11;
    }
LAB_0012beeb:
    if (bVar13) {
      pbVar9 = pbVar9 + 1;
      iVar11 = -2;
      if (pbVar9 == pbVar1) {
LAB_0012bf70:
        iVar8 = iVar11;
        bVar13 = false;
      }
      else {
        sVar15 = 0;
        do {
          bVar2 = pbVar9[sVar15];
          if (bVar2 == 0x20) {
            *path = (char *)pbVar9;
            *path_len = sVar15;
            pbVar9 = pbVar9 + sVar15;
            bVar13 = true;
            goto LAB_0012bf72;
          }
          if (bVar2 - 0x7f < 0xffffffa1) {
            if ((bVar2 < 0x20) || (bVar2 == 0x7f)) {
              pbVar9 = pbVar9 + sVar15;
              iVar11 = -1;
              goto LAB_0012bf70;
            }
          }
          else if (bVar2 == 0x3f) {
            *has_query = true;
          }
          lVar4 = sVar15 + 1;
          sVar15 = sVar15 + 1;
        } while (pbVar9 + lVar4 != pbVar1);
        bVar13 = false;
        pbVar9 = pbVar1;
        iVar8 = -2;
      }
LAB_0012bf72:
      if (!bVar13) {
        pbVar9 = (byte *)0x0;
        goto LAB_0012c36f;
      }
      if ((long)pbVar1 - (long)(pbVar9 + 1) < 9) {
        iVar11 = -2;
LAB_0012bfda:
        iVar8 = iVar11;
        pbVar16 = (byte *)0x0;
      }
      else {
        iVar11 = -1;
        if (((((pbVar9[1] != 0x48) || (pbVar9[2] != 0x54)) || (pbVar9[3] != 0x54)) ||
            ((pbVar9[4] != 0x50 || (pbVar9[5] != 0x2f)))) ||
           ((pbVar9[6] != 0x31 || ((pbVar9[7] != 0x2e || ((byte)(pbVar9[8] - 0x3a) < 0xf6))))))
        goto LAB_0012bfda;
        pbVar16 = pbVar9 + 9;
        *minor_version = (uint)(byte)(pbVar9[8] - 0x30);
      }
      if (pbVar16 != (byte *)0x0) {
        bVar2 = *pbVar16;
        pbVar5 = (byte *)(ulong)bVar2;
        if (bVar2 == 10) {
          pbVar16 = pbVar16 + 1;
LAB_0012c02b:
          cVar14 = '\x01';
          pbVar9 = pbVar16;
          if (pbVar16 != pbVar1) {
            bVar2 = *pbVar16;
            if (bVar2 == 10) {
              cVar14 = '\x02';
              pbVar9 = pbVar16 + 1;
              goto LAB_0012c08c;
            }
            if (bVar2 == 0xd) {
              if (pbVar16 + 1 == pbVar1) {
                pbVar9 = pbVar16 + 1;
                iVar8 = -2;
              }
              else {
                if (pbVar16[1] != 10) {
                  iVar8 = -1;
                }
                cVar14 = (pbVar16[1] == 10) + '\x01';
                pbVar9 = pbVar16 + 2;
              }
              goto LAB_0012c08c;
            }
            sVar15 = *num_headers;
            if (sVar15 == sVar3) {
              iVar8 = -1;
              goto LAB_0012c08c;
            }
            if ((sVar15 == 0) || ((bVar2 != 9 && (bVar2 != 0x20)))) {
              pbVar6 = (byte *)0x0;
              do {
                if ((ulong)*pbVar9 == 0x3a) {
                  if (pbVar6 == (byte *)0x0) {
                    pbVar5 = (byte *)0x0;
LAB_0012c133:
                    pbVar6 = pbVar5;
                    bVar13 = false;
                    iVar11 = -1;
                  }
                  else {
                    pbVar9 = pbVar9 + 1;
                    iVar11 = -2;
                    if (pbVar9 != pbVar1) goto LAB_0012c105;
                    bVar13 = false;
                  }
                  goto LAB_0012c146;
                }
                if (""[*pbVar9] == '\0') goto LAB_0012c133;
                pbVar9 = pbVar9 + 1;
                pbVar6 = pbVar6 + 1;
              } while (pbVar9 != pbVar1);
              bVar13 = false;
              pbVar6 = pbVar5;
              pbVar9 = pbVar1;
              iVar11 = -2;
              goto LAB_0012c146;
            }
            pbVar6 = (byte *)0x0;
            iVar11 = iVar8;
            pbVar10 = (byte *)0x0;
            goto joined_r0x0012c161;
          }
          iVar8 = -2;
          goto LAB_0012c08c;
        }
        if (bVar2 == 0xd) {
          pbVar5 = pbVar16 + 1;
          if (pbVar5 == pbVar1) {
            iVar8 = -2;
            goto LAB_0012c36d;
          }
          if (pbVar16[1] == 10) {
            pbVar16 = pbVar16 + 2;
            goto LAB_0012c02b;
          }
        }
        pbVar9 = (byte *)0x0;
        iVar8 = -1;
        goto LAB_0012c36f;
      }
    }
  }
LAB_0012c36d:
  pbVar9 = (byte *)0x0;
LAB_0012c36f:
  if (pbVar9 != (byte *)0x0) {
    iVar8 = (int)pbVar9 - ((int)buf_start + (int)last_len);
  }
  return iVar8;
  while (pbVar9 = pbVar9 + 1, pbVar9 != pbVar1) {
LAB_0012c105:
    if ((*pbVar9 != 0x20) && (*pbVar9 != 9)) {
      bVar13 = true;
      iVar11 = iVar8;
      goto LAB_0012c146;
    }
  }
  bVar13 = false;
  pbVar9 = pbVar1;
LAB_0012c146:
  pbVar5 = pbVar6;
  iVar8 = iVar11;
  pbVar10 = pbVar16;
  pbVar16 = pbVar9;
  if (!bVar13) goto LAB_0012c08c;
joined_r0x0012c161:
  while (7 < (long)pbVar1 - (long)pbVar9) {
    if (*pbVar9 - 0x7f < 0xffffffa1) {
LAB_0012c203:
      bVar2 = *pbVar9;
      if (((bVar2 < 0x20) && (bVar2 != 9)) || (bVar2 == 0x7f)) goto LAB_0012c25c;
      pbVar9 = pbVar9 + 1;
    }
    else {
      if (pbVar9[1] - 0x7f < 0xffffffa1) {
        pbVar9 = pbVar9 + 1;
        goto LAB_0012c203;
      }
      if (pbVar9[2] - 0x7f < 0xffffffa1) {
        pbVar9 = pbVar9 + 2;
        goto LAB_0012c203;
      }
      if (pbVar9[3] - 0x7f < 0xffffffa1) {
        pbVar9 = pbVar9 + 3;
        goto LAB_0012c203;
      }
      if (pbVar9[4] - 0x7f < 0xffffffa1) {
        pbVar9 = pbVar9 + 4;
        goto LAB_0012c203;
      }
      if (pbVar9[5] - 0x7f < 0xffffffa1) {
        pbVar9 = pbVar9 + 5;
        goto LAB_0012c203;
      }
      if (pbVar9[6] - 0x7f < 0xffffffa1) {
        pbVar9 = pbVar9 + 6;
        goto LAB_0012c203;
      }
      if (pbVar9[7] - 0x7f < 0xffffffa1) {
        pbVar9 = pbVar9 + 7;
        goto LAB_0012c203;
      }
      pbVar9 = pbVar9 + 8;
    }
  }
  iVar8 = -2;
  for (; pbVar9 != pbVar1; pbVar9 = pbVar9 + 1) {
    bVar2 = *pbVar9;
    if ((bVar2 - 0x7f < 0xffffffa1) && (((bVar2 < 0x20 && (bVar2 != 9)) || (bVar2 == 0x7f))))
    goto LAB_0012c25c;
  }
  pbVar7 = (byte *)0x0;
LAB_0012c29e:
  pbVar5 = pbVar6;
  if (pbVar7 == (byte *)0x0) {
    pbVar9 = (byte *)0x0;
  }
  else {
    if ((pbVar6 == (byte *)0xa) &&
       (pbVar10[9] == 0x6e && *(long *)(pbVar10 + 1) == 0x6f697463656e6e6f)) {
      *has_connection = true;
      pbVar12 = has_upgrade;
      if (((*local_48 & 0xdf) == 0x55) || (pbVar12 = has_close, (*local_48 & 0xdf) == 0x43)) {
        *pbVar12 = true;
      }
    }
    headers[sVar15].name._M_len = (size_t)pbVar6;
    headers[sVar15].name._M_str = (char *)pbVar10;
    headers[sVar15].value._M_len = local_40;
    headers[sVar15].value._M_str = (char *)local_48;
    cVar14 = '\0';
    pbVar9 = pbVar7;
  }
LAB_0012c08c:
  if (cVar14 != '\0') goto LAB_0012c360;
  *num_headers = *num_headers + 1;
  pbVar16 = pbVar9;
  goto LAB_0012c02b;
LAB_0012c25c:
  iVar8 = -1;
  if (*pbVar9 == 0xd) {
    if (pbVar9 + 1 == pbVar1) {
      iVar8 = -2;
    }
    else if (pbVar9[1] == 10) {
      pbVar7 = pbVar9 + 2;
      local_40 = (long)pbVar9 - (long)pbVar16;
      local_48 = pbVar16;
      iVar8 = iVar11;
      goto LAB_0012c29e;
    }
  }
  else if (*pbVar9 == 10) {
    local_40 = (long)pbVar9 - (long)pbVar16;
    pbVar7 = pbVar9 + 1;
    local_48 = pbVar16;
    iVar8 = iVar11;
    goto LAB_0012c29e;
  }
  pbVar7 = (byte *)0x0;
  goto LAB_0012c29e;
LAB_0012c360:
  if (cVar14 != '\x01') goto LAB_0012c36f;
  goto LAB_0012c36d;
}

Assistant:

inline int phr_parse_request(const char *buf_start, size_t len,
                             const char **method, size_t *method_len,
                             const char **path, size_t *path_len,
                             int *minor_version, http_header *headers,
                             size_t *num_headers, size_t last_len,
                             bool &has_connection, bool &has_close,
                             bool &has_upgrade, bool &has_query) {
  const char *buf = buf_start, *buf_end = buf_start + len;
  size_t max_headers = *num_headers;
  int r;

  *method = NULL;
  *method_len = 0;
  *path = NULL;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;

  /* if last_len != 0, check if the request is complete (a fast countermeasure
  againt slowloris */
  if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
    return r;
  }

  if ((buf = parse_request(buf + last_len, buf_end, method, method_len, path,
                           path_len, minor_version, headers, num_headers,
                           max_headers, &r, has_connection, has_close,
                           has_upgrade, has_query)) == NULL) {
    return r;
  }

  return (int)(buf - buf_start - last_len);
}